

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ExpandListArgument
               (string *arg,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newargs,bool emptyArgs)

{
  byte bVar1;
  long lVar2;
  undefined7 in_register_00000011;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  string newArg;
  value_type local_50;
  
  if (((int)CONCAT71(in_register_00000011,emptyArgs) == 0) && (arg->_M_string_length == 0)) {
    return;
  }
  iVar3 = 0;
  lVar2 = std::__cxx11::string::find((char)arg,0x3b);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(newargs,arg);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar4 = (byte *)(arg->_M_dataplus)._M_p;
  pbVar5 = pbVar4;
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x3b) {
        if (iVar3 == 0) {
          std::__cxx11::string::append((char *)&local_50,(ulong)pbVar5);
          pbVar5 = pbVar4 + 1;
          iVar3 = 0;
          if (local_50._M_string_length != 0 || emptyArgs) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(newargs,&local_50);
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
            iVar3 = 0;
          }
        }
      }
      else if (bVar1 == 0x5b) {
        iVar3 = iVar3 + 1;
      }
      else if (bVar1 == 0) {
        std::__cxx11::string::append((char *)&local_50);
        if (local_50._M_string_length != 0 || emptyArgs) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(newargs,&local_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return;
        }
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
        return;
      }
    }
    else if (bVar1 == 0x5c) {
      if (pbVar4[1] == 0x3b) {
        std::__cxx11::string::append((char *)&local_50,(ulong)pbVar5);
        pbVar4 = pbVar4 + 1;
        pbVar5 = pbVar4;
      }
    }
    else if (bVar1 == 0x5d) {
      iVar3 = iVar3 + -1;
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void cmSystemTools::ExpandListArgument(const std::string& arg,
                                       std::vector<std::string>& newargs,
                                       bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }
  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == std::string::npos) {
    newargs.push_back(arg);
    return;
  }
  std::string newArg;
  const char* last = arg.c_str();
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  for (const char* c = last; *c; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        const char* next = c + 1;
        if (*next == ';') {
          newArg.append(last, c - last);
          // Skip over the escape character
          last = c = next;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c - last);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            newargs.push_back(newArg);
            newArg.clear();
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    newargs.push_back(newArg);
  }
}